

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_test.c
# Opt level: O3

void test_address_busy(void)

{
  nng_err nVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  nng_dialer local_40;
  nng_socket local_3c;
  nng_dialer d;
  nng_socket s2;
  nng_listener l;
  nng_socket s1;
  
  d.id = 0;
  local_40.id = 0;
  nVar1 = nng_pair1_open(&s2);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                         ,0xdd,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar4,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_pair1_open(&local_3c);
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                           ,0xde,"%s: expected success, got %s (%d)","nng_pair1_open(&(s2))",pcVar4,
                           nVar1);
    if (iVar2 != 0) {
      uVar3 = nng_listener_id((nng_listener)0x0);
      acutest_check_(uVar3 >> 0x1f,
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                     ,0xe0,"%s","nng_listener_id(l) < 0");
      nVar1 = nng_listen(s2,"inproc://eaddrinuse",(nng_listener *)&d,0);
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                             ,0xe1,"%s: expected success, got %s (%d)","nng_listen(s1, a, &l, 0)",
                             pcVar4,nVar1);
      if (iVar2 != 0) {
        iVar2 = nng_listener_id((nng_listener)d.id);
        acutest_check_((uint)(0 < iVar2),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                       ,0xe2,"%s","nng_listener_id(l) > 0");
        nVar1 = nng_listen(s2,"inproc://eaddrinuse",(nng_listener *)0x0,0);
        pcVar4 = nng_strerror(NNG_EADDRINUSE);
        acutest_check_((uint)(nVar1 == NNG_EADDRINUSE),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                       ,0xe5,"%s fails with %s","nng_listen(s1, a, NULL, 0)",pcVar4);
        pcVar4 = nng_strerror(NNG_EADDRINUSE);
        pcVar5 = nng_strerror(nVar1);
        acutest_message_("%s: expected %s (%d), got %s (%d)","nng_listen(s1, a, NULL, 0)",pcVar4,10,
                         pcVar5,(ulong)nVar1);
        nVar1 = nng_listener_start((nng_listener)d.id,0);
        pcVar4 = nng_strerror(NNG_ESTATE);
        acutest_check_((uint)(nVar1 == NNG_ESTATE),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                       ,0xe8,"%s fails with %s","nng_listener_start(l, 0)",pcVar4);
        pcVar4 = nng_strerror(NNG_ESTATE);
        pcVar5 = nng_strerror(nVar1);
        acutest_message_("%s: expected %s (%d), got %s (%d)","nng_listener_start(l, 0)",pcVar4,0xb,
                         pcVar5,(ulong)nVar1);
        uVar3 = nng_dialer_id((nng_dialer)0x0);
        acutest_check_(uVar3 >> 0x1f,
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                       ,0xeb,"%s","nng_dialer_id(d) < 0");
        nVar1 = nng_dial(local_3c,"inproc://eaddrinuse",&local_40,0);
        pcVar4 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                               ,0xec,"%s: expected success, got %s (%d)","nng_dial(s2, a, &d, 0)",
                               pcVar4,nVar1);
        if (iVar2 != 0) {
          iVar2 = nng_dialer_id(local_40);
          acutest_check_((uint)(0 < iVar2),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                         ,0xed,"%s","nng_dialer_id(d) > 0");
          nVar1 = nng_socket_close(s2);
          pcVar4 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                                 ,0xef,"%s: expected success, got %s (%d)","nng_socket_close(s1)",
                                 pcVar4,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_socket_close(local_3c);
            pcVar4 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                                   ,0xf0,"%s: expected success, got %s (%d)","nng_socket_close(s2)",
                                   pcVar4,nVar1);
            if (iVar2 != 0) {
              return;
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_address_busy(void)
{
	char        *a = "inproc://eaddrinuse";
	nng_listener l = NNG_LISTENER_INITIALIZER;
	nng_dialer   d = NNG_DIALER_INITIALIZER;
	nng_socket   s1;
	nng_socket   s2;

	NUTS_OPEN(s1);
	NUTS_OPEN(s2);

	NUTS_TRUE(nng_listener_id(l) < 0);
	NUTS_PASS(nng_listen(s1, a, &l, 0));
	NUTS_TRUE(nng_listener_id(l) > 0);

	// Cannot start another one.
	NUTS_FAIL(nng_listen(s1, a, NULL, 0), NNG_EADDRINUSE);

	// We can't restart it -- it's already running
	NUTS_FAIL(nng_listener_start(l, 0), NNG_ESTATE);

	// We can connect to it.
	NUTS_TRUE(nng_dialer_id(d) < 0);
	NUTS_PASS(nng_dial(s2, a, &d, 0));
	NUTS_TRUE(nng_dialer_id(d) > 0);

	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
}